

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

void __thiscall
axl::sl::
OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
::clear(OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
        *this)

{
  AppStoreIap *pAVar1;
  AppStoreIap *p;
  Delete<axl::cry::AppStoreIap> local_19;
  
  p = (this->
      super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
      ).super_ListData<axl::cry::AppStoreIap>.m_head;
  if (p != (AppStoreIap *)0x0) {
    while (p != (AppStoreIap *)0x0) {
      pAVar1 = (AppStoreIap *)(p->super_ListLink).m_next;
      mem::Delete<axl::cry::AppStoreIap>::operator()(&local_19,p);
      p = pAVar1;
    }
    (this->
    super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::cry::AppStoreIap>.m_head = (AppStoreIap *)0x0;
    (this->
    super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::cry::AppStoreIap>.m_tail = (AppStoreIap *)0x0;
    (this->
    super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::cry::AppStoreIap>.m_count = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}